

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestChooseGenerator.cpp
# Opt level: O0

void __thiscall AxA_isGreaterThan_A::AxA_isGreaterThan_A(AxA_isGreaterThan_A *this)

{
  StatelessGenerator<int> *in_RDI;
  Generator<int> *this_00;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  Property<int,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type>
  *in_stack_ffffffffffffffe0;
  Generator<int> local_18 [3];
  
  this_00 = local_18;
  cppqc::choose<int>(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
  cppqc::Generator<int>::Generator(this_00,in_RDI);
  cppqc::
  Property<int,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type>
  ::Property(in_stack_ffffffffffffffe0,
             (Generator<int> *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  cppqc::Generator<int>::~Generator((Generator<int> *)0x115456);
  cppqc::StatelessGenerator<int>::~StatelessGenerator((StatelessGenerator<int> *)0x115460);
  (in_RDI->m_gen)._M_t.
  super___uniq_ptr_impl<cppqc::detail::StatelessGenConcept<int>,_std::default_delete<cppqc::detail::StatelessGenConcept<int>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_cppqc::detail::StatelessGenConcept<int>_*,_std::default_delete<cppqc::detail::StatelessGenConcept<int>_>_>
  .super__Head_base<0UL,_cppqc::detail::StatelessGenConcept<int>_*,_false>._M_head_impl =
       (StatelessGenConcept<int> *)&PTR_expect_00124b20;
  return;
}

Assistant:

AxA_isGreaterThan_A() : Property(cppqc::choose(MIN, MAX)) {}